

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFEmitter.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_3b35295::DumpVisitor::onValue(DumpVisitor *this,int64_t S,bool LEB)

{
  undefined7 in_register_00000011;
  size_t local_10;
  
  if ((int)CONCAT71(in_register_00000011,LEB) != 0) {
    llvm::encodeSLEB128(S,this->OS,0);
    return;
  }
  local_10 = (ulong)S >> 0x38 | (S & 0xff000000000000U) >> 0x28 | (S & 0xff0000000000U) >> 0x18 |
             (S & 0xff00000000U) >> 8 | (S & 0xff000000U) << 8 | (S & 0xff0000U) << 0x18 |
             (S & 0xff00U) << 0x28 | S << 0x38;
  if (((this->super_ConstVisitor).super_VisitorImpl<const_llvm::DWARFYAML::Data>.DebugInfo)->
      IsLittleEndian != false) {
    local_10 = S;
  }
  llvm::raw_ostream::write(this->OS,(int)&local_10,(void *)0x8,local_10);
  return;
}

Assistant:

void onValue(const int64_t S, const bool LEB = false) override {
    if (LEB)
      encodeSLEB128(S, OS);
    else
      writeInteger(S, OS, DebugInfo.IsLittleEndian);
  }